

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O2

void __thiscall
icu_63::ThaiBreakEngine::ThaiBreakEngine
          (ThaiBreakEngine *this,DictionaryMatcher *adoptDictionary,UErrorCode *status)

{
  UnicodeSet *this_00;
  UnicodeSet *this_01;
  UnicodeSet *this_02;
  UnicodeSet *this_03;
  UnicodeSet *this_04;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__ThaiBreakEngine_003b2bc8;
  this_00 = &this->fThaiWordSet;
  UnicodeSet::UnicodeSet(this_00);
  this_01 = &this->fEndWordSet;
  UnicodeSet::UnicodeSet(this_01);
  this_02 = &this->fBeginWordSet;
  UnicodeSet::UnicodeSet(this_02);
  this_03 = &this->fSuffixSet;
  UnicodeSet::UnicodeSet(this_03);
  this_04 = &this->fMarkSet;
  UnicodeSet::UnicodeSet(this_04);
  this->fDictionary = adoptDictionary;
  local_98.p_ = L"[[:Thai:]&[:LineBreak=SA:]]";
  UnicodeString::UnicodeString(&local_70,'\x01',&local_98,-1);
  UnicodeSet::applyPattern(this_00,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  local_80 = local_98.p_;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
              (this,this_00);
  }
  local_a0.p_ = L"[[:Thai:]&[:LineBreak=SA:]&[:M:]]";
  UnicodeString::UnicodeString(&local_70,'\x01',&local_a0,-1);
  UnicodeSet::applyPattern(this_04,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  local_90 = local_a0.p_;
  UnicodeSet::add(this_04,0x20);
  UnicodeSet::operator=(this_01,this_00);
  UnicodeSet::remove(this_01,(char *)0xe31);
  UnicodeSet::remove(this_01,(char *)0xe40);
  UnicodeSet::add(this_02,0xe01,0xe2e);
  UnicodeSet::add(this_02,0xe40,0xe44);
  UnicodeSet::add(this_03,0xe2f);
  UnicodeSet::add(this_03,0xe46);
  UnicodeSet::compact(this_04);
  UnicodeSet::compact(this_01);
  UnicodeSet::compact(this_02);
  UnicodeSet::compact(this_03);
  return;
}

Assistant:

ThaiBreakEngine::ThaiBreakEngine(DictionaryMatcher *adoptDictionary, UErrorCode &status)
    : DictionaryBreakEngine(),
      fDictionary(adoptDictionary)
{
    fThaiWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Thai:]&[:LineBreak=SA:]]"), status);
    if (U_SUCCESS(status)) {
        setCharacters(fThaiWordSet);
    }
    fMarkSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Thai:]&[:LineBreak=SA:]&[:M:]]"), status);
    fMarkSet.add(0x0020);
    fEndWordSet = fThaiWordSet;
    fEndWordSet.remove(0x0E31);             // MAI HAN-AKAT
    fEndWordSet.remove(0x0E40, 0x0E44);     // SARA E through SARA AI MAIMALAI
    fBeginWordSet.add(0x0E01, 0x0E2E);      // KO KAI through HO NOKHUK
    fBeginWordSet.add(0x0E40, 0x0E44);      // SARA E through SARA AI MAIMALAI
    fSuffixSet.add(THAI_PAIYANNOI);
    fSuffixSet.add(THAI_MAIYAMOK);

    // Compact for caching.
    fMarkSet.compact();
    fEndWordSet.compact();
    fBeginWordSet.compact();
    fSuffixSet.compact();
}